

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT cell;
  ulong uVar4;
  REF_DBL uv_area;
  REF_DBL area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  double local_c8;
  REF_GEOM local_c0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8 [3];
  REF_INT local_9c;
  
  ref_cell = ref_grid->cell[3];
  uVar4 = 0xffffffff;
  if (-1 < node) {
    uVar4 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar4 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar4].ref;
    ref_node = ref_grid->node;
    local_c0 = ref_grid->geom;
    do {
      uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x48,"ref_collapse_post_uv_area",(ulong)uVar3,"cell nodes");
        return uVar3;
      }
      uVar3 = ref_node_tri_area(ref_node,local_a8,&local_b8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x49,"ref_collapse_post_uv_area",(ulong)uVar3,"vol");
        return uVar3;
      }
      uVar3 = ref_geom_uv_area(local_c0,local_a8,&local_c8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x4a,"ref_collapse_post_uv_area",(ulong)uVar3,"uv area");
        return uVar3;
      }
      uVar3 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_b0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x4b,"ref_collapse_post_uv_area",(ulong)uVar3,"sign");
        return uVar3;
      }
      local_c8 = local_b0 * local_c8;
      if (local_c8 < 1e-20) {
        printf("area %e uv area %e bool %d\n",local_b8,(ulong)(local_c8 < ref_node->min_uv_area));
        return 1;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar4].next;
      uVar4 = (ulong)iVar1;
      if (uVar4 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar4].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid, REF_INT node) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL sign_uv_area, uv_area, area;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
    uv_area *= sign_uv_area;
    if (uv_area < 1.0e-20) {
      printf("area %e uv area %e bool %d\n", area, uv_area,
             uv_area < ref_node_min_uv_area(ref_node));
      return REF_FAILURE;
    }
  }
  return REF_SUCCESS;
}